

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

void WriteVarInt<VectorWriter,(VarIntMode)1,int>(VectorWriter *os,int n)

{
  uint uVar1;
  ulong in_RCX;
  ulong uVar2;
  long in_FS_OFFSET;
  bool bVar3;
  uchar tmp [5];
  byte local_26;
  byte local_25 [5];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_25[0] = (byte)n & 0x7f;
  if (n < 0x80) {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    in_RCX = (ulong)(uint)n;
    do {
      uVar1 = (int)(in_RCX >> 7) - 1;
      in_RCX = (ulong)uVar1;
      local_25[uVar2 + 1] = (byte)uVar1 | 0x80;
      uVar2 = uVar2 + 1;
      bVar3 = 0x407f < (uint)n;
      n = uVar1;
    } while (bVar3);
    uVar2 = uVar2 & 0xffffffff;
  }
  do {
    local_26 = local_25[uVar2];
    VectorWriter::write(os,(int)&local_26,(void *)0x1,in_RCX);
    bVar3 = uVar2 != 0;
    uVar2 = uVar2 - 1;
  } while (bVar3);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteVarInt(Stream& os, I n)
{
    CheckVarIntMode<Mode, I>();
    unsigned char tmp[(sizeof(n)*8+6)/7];
    int len=0;
    while(true) {
        tmp[len] = (n & 0x7F) | (len ? 0x80 : 0x00);
        if (n <= 0x7F)
            break;
        n = (n >> 7) - 1;
        len++;
    }
    do {
        ser_writedata8(os, tmp[len]);
    } while(len--);
}